

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<char,fmt::v5::basic_format_specs<char>>::hex_writer::operator()
          (hex_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  undefined8 *in_RSI;
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> in_stack_00000000;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined1 local_18;
  bool in_stack_ffffffffffffffef;
  
  internal::
  format_uint<4u,char,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_int>
            (in_stack_00000000,(uint)((ulong)in_RSI >> 0x20),(int)in_RSI,in_stack_ffffffffffffffef);
  *in_RSI = local_30;
  in_RSI[1] = local_28;
  in_RSI[2] = local_20;
  *(undefined1 *)(in_RSI + 3) = local_18;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<4, char_type>(
              it, self.abs_value, num_digits, self.spec.type != 'x');
      }